

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_echo.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  in_addr_t iVar2;
  int iVar3;
  uint uVar4;
  LIBSSH2_SESSION *session;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  undefined1 *puVar10;
  ulong uVar11;
  byte bVar12;
  fd_set *__readfds;
  int iVar13;
  char *unaff_R13;
  fd_set *__writefds;
  char *exitsignal;
  size_t len;
  int type;
  sockaddr_in sin;
  libssh2_knownhost *host;
  timeval tStack_7e40;
  fd_set fStack_7e30;
  ulong uStack_7da8;
  char *pcStack_7da0;
  LIBSSH2_SESSION *pLStack_7d98;
  code *pcStack_7d90;
  long *local_7d88;
  uint local_7d78;
  uint local_7d74;
  char *local_7d70;
  undefined1 *local_7d68;
  undefined8 local_7d60;
  char *local_7d58;
  undefined1 local_7d4c [4];
  sockaddr local_7d48;
  long local_7d38 [4001];
  
  local_7d70 = "none";
  if (1 < argc) {
    hostname = argv[1];
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  pcStack_7d90 = (code *)0x102630;
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    pcStack_7d90 = (code *)0x102789;
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  pcStack_7d90 = (code *)0x102644;
  iVar2 = inet_addr(hostname);
  pcStack_7d90 = (code *)0x10265a;
  uVar1 = socket(2,1,0);
  if (uVar1 == 0xffffffff) {
    pcStack_7d90 = (code *)0x102798;
    main_cold_14();
  }
  else {
    local_7d48.sa_family = 2;
    local_7d48.sa_data[0] = '\0';
    local_7d48.sa_data[1] = '\x16';
    pcStack_7d90 = (code *)0x102680;
    local_7d48.sa_data._2_4_ = iVar2;
    iVar3 = connect(uVar1,&local_7d48,0x10);
    if (iVar3 == 0) {
      pcStack_7d90 = (code *)0x102697;
      session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
      if (session != (LIBSSH2_SESSION *)0x0) {
        pcStack_7d90 = (code *)0x1026ad;
        libssh2_session_set_blocking(session,0);
        do {
          pcStack_7d90 = (code *)0x1026b7;
          uVar4 = libssh2_session_handshake(session,uVar1);
        } while (uVar4 == 0xffffffdb);
        if (uVar4 != 0) {
          iVar3 = 0;
          pcStack_7d90 = (code *)0x1027cc;
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar4);
          goto LAB_00102b78;
        }
        pcStack_7d90 = (code *)0x1026cc;
        pcVar5 = (char *)libssh2_knownhost_init(session);
        if (pcVar5 == (char *)0x0) {
          return 2;
        }
        pcStack_7d90 = (code *)0x1026ec;
        libssh2_knownhost_readfile(pcVar5,"known_hosts",1);
        pcStack_7d90 = (code *)0x102700;
        libssh2_knownhost_writefile(pcVar5,"dumpfile",1);
        pcStack_7d90 = (code *)0x102712;
        lVar6 = libssh2_session_hostkey(session,&local_7d60,local_7d4c);
        if (lVar6 == 0) {
          return 3;
        }
        local_7d88 = local_7d38;
        pcStack_7d90 = (code *)0x10274b;
        uVar4 = libssh2_knownhost_checkp(pcVar5,hostname,0x16,lVar6,local_7d60,0x10001);
        if ((int)uVar4 < 2) {
          pcVar9 = *(char **)(local_7d38[0] + 0x18);
        }
        else {
          pcVar9 = "<none>";
        }
        pcStack_7d90 = (code *)0x1027e8;
        fprintf(_stderr,"Host check: %d, key: %s\n",(ulong)uVar4,pcVar9);
        pcStack_7d90 = (code *)0x1027f0;
        libssh2_knownhost_free(pcVar5);
        if (*password == '\0') {
LAB_00102841:
          pcStack_7d90 = (code *)0x10284e;
          libssh2_trace(session,0x200);
          local_7d88 = (long *)((ulong)local_7d88 & 0xffffffff00000000);
          pcStack_7d90 = (code *)0x102877;
          pcVar9 = (char *)libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0);
          if (pcVar9 == (char *)0x0) {
            pcVar7 = "session";
            do {
              pcStack_7d90 = (code *)0x102891;
              iVar3 = libssh2_session_last_error(session,0,0,0);
              pcVar9 = pcVar5;
              if (iVar3 != -0x25) goto LAB_00102bf6;
              pcStack_7d90 = (code *)0x1028a4;
              waitsocket(uVar1,session);
              local_7d88 = (long *)((ulong)local_7d88 & 0xffffffff00000000);
              pcStack_7d90 = (code *)0x1028c9;
              pcVar9 = (char *)libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0);
            } while (pcVar9 == (char *)0x0);
          }
          pcVar7 = "exec";
          unaff_R13 = "cat";
          while( true ) {
            pcStack_7d90 = (code *)0x1028f8;
            iVar3 = libssh2_channel_process_startup(pcVar9,"exec",4,"cat",3);
            if (iVar3 != -0x25) break;
            pcStack_7d90 = (code *)0x102907;
            waitsocket(uVar1,session);
          }
          if (iVar3 != 0) {
            pcStack_7d90 = (code *)0x102bf6;
            main_cold_12();
LAB_00102bf6:
            pcStack_7d90 = (code *)0x102bfb;
            main_cold_3();
            goto LAB_00102bfb;
          }
          pcStack_7d90 = (code *)0x102925;
          memset(local_7d38,0x41,32000);
          pcStack_7d90 = (code *)0x10292f;
          puVar10 = (undefined1 *)malloc(0x20);
          if (puVar10 != (undefined1 *)0x0) {
            *puVar10 = 2;
            *(char **)(puVar10 + 8) = pcVar9;
            local_7d68 = puVar10 + 0x10;
            *(undefined8 *)(puVar10 + 0x10) = 5;
            unaff_R13 = (char *)0x0;
            pcVar7 = (char *)0x0;
            local_7d74 = 0;
            local_7d78 = 0;
            do {
              pcStack_7d90 = (code *)0x10297b;
              iVar3 = libssh2_poll(puVar10,1,10);
              bVar12 = 0;
              if (0 < iVar3) {
                if ((puVar10[0x18] & 1) != 0) {
                  pcStack_7d90 = (code *)0x1029b7;
                  lVar6 = libssh2_channel_read_ex(pcVar9,0,local_7d38,32000);
                  if (lVar6 == -0x25) {
                    local_7d74 = local_7d74 + 1;
                    pcStack_7d90 = (code *)0x1029e5;
                    fwrite("will read again\n",0x10,1,_stderr);
                  }
                  else {
                    if (lVar6 < 0) goto LAB_00102c00;
                    pcVar7 = pcVar7 + lVar6;
                    pcStack_7d90 = (code *)0x102a73;
                    fprintf(_stderr,"read %ld bytes (%lu in total)\n",lVar6,pcVar7);
                  }
                  bVar12 = 1;
                }
                if ((puVar10[0x18] & 4) != 0) {
                  if (unaff_R13 < (char *)0x16e360) {
                    uVar11 = 1500000 - (long)unaff_R13;
                    if (31999 < uVar11) {
                      uVar11 = 32000;
                    }
                    pcStack_7d90 = (code *)0x102a1a;
                    lVar6 = libssh2_channel_write_ex(pcVar9,0,local_7d38,uVar11);
                    if (lVar6 == -0x25) {
                      local_7d78 = local_7d78 + 1;
                      pcStack_7d90 = (code *)0x102a44;
                      fwrite("will write again\n",0x11,1,_stderr);
                    }
                    else {
                      if (lVar6 < 0) goto LAB_00102c0a;
                      pcStack_7d90 = (code *)0x102aaa;
                      main_cold_8();
                      unaff_R13 = local_7d58;
                    }
                  }
                  else {
                    pcStack_7d90 = (code *)0x102a85;
                    iVar3 = libssh2_channel_send_eof(pcVar9);
                    if (iVar3 == -0x25) {
                      pcStack_7d90 = (code *)0x102a8f;
                      main_cold_7();
                    }
                    else {
                      if (iVar3 < 0) goto LAB_00102c05;
                      pcStack_7d90 = (code *)0x102acd;
                      main_cold_5();
                    }
                  }
                  bVar12 = 1;
                }
                bVar12 = bVar12 == 0 & (byte)puVar10[0x18] >> 7;
              }
            } while (bVar12 == 0);
            while( true ) {
              pcStack_7d90 = (code *)0x102ae9;
              iVar3 = libssh2_channel_close(pcVar9);
              if (iVar3 != -0x25) break;
              pcStack_7d90 = (code *)0x102ae1;
              waitsocket(uVar1,session);
            }
            if (iVar3 == 0) {
              pcStack_7d90 = (code *)0x102afa;
              iVar3 = libssh2_channel_get_exit_status(pcVar9);
              local_7d88 = (long *)0x0;
              pcStack_7d90 = (code *)0x102b1b;
              libssh2_channel_get_exit_signal(pcVar9,&local_7d70,0,0,0,0);
            }
            else {
              iVar3 = 0x7f;
            }
            if (local_7d70 != (char *)0x0) {
              pcStack_7d90 = (code *)0x102b44;
              fprintf(_stderr,"\nGot signal: %s\n");
            }
            pcStack_7d90 = (code *)0x102b4c;
            libssh2_channel_free(pcVar9);
            pcStack_7d90 = (code *)0x102b6f;
            fprintf(_stderr,"\nrereads: %d rewrites: %d totwritten %lu\n",(ulong)local_7d74,
                    (ulong)local_7d78,unaff_R13);
            if (unaff_R13 != pcVar7) goto LAB_00102c14;
            goto LAB_00102b78;
          }
        }
        else {
          do {
            pcVar9 = username;
            pcStack_7d90 = (code *)0x10280b;
            pcVar7 = (char *)strlen(username);
            unaff_R13 = password;
            pcStack_7d90 = (code *)0x10281d;
            sVar8 = strlen(password);
            pcStack_7d90 = (code *)0x102834;
            iVar3 = libssh2_userauth_password_ex
                              (session,pcVar9,(ulong)pcVar7 & 0xffffffff,unaff_R13,
                               sVar8 & 0xffffffff,0);
          } while (iVar3 == -0x25);
          pcVar5 = pcVar9;
          if (iVar3 == 0) goto LAB_00102841;
LAB_00102bfb:
          pcStack_7d90 = (code *)0x102c00;
          main_cold_2();
LAB_00102c00:
          pcStack_7d90 = (code *)0x102c05;
          main_cold_4();
LAB_00102c05:
          pcStack_7d90 = (code *)0x102c0a;
          main_cold_6();
LAB_00102c0a:
          pcStack_7d90 = (code *)0x102c0f;
          main_cold_9();
        }
        pcStack_7d90 = (code *)0x102c14;
        main_cold_11();
LAB_00102c14:
        iVar13 = (int)unaff_R13;
        pcStack_7d90 = waitsocket;
        pcVar5 = pcVar7;
        main_cold_10();
        pcStack_7d90 = (code *)pcVar9;
        pLStack_7d98 = session;
        pcStack_7da0 = pcVar7;
        uStack_7da8 = (ulong)uVar1;
        tStack_7e40.tv_sec = 10;
        tStack_7e40.tv_usec = 0;
        fStack_7e30.fds_bits[0] = 0;
        fStack_7e30.fds_bits[1] = 0;
        fStack_7e30.fds_bits[2] = 0;
        fStack_7e30.fds_bits[3] = 0;
        fStack_7e30.fds_bits[4] = 0;
        fStack_7e30.fds_bits[5] = 0;
        fStack_7e30.fds_bits[6] = 0;
        fStack_7e30.fds_bits[7] = 0;
        fStack_7e30.fds_bits[8] = 0;
        fStack_7e30.fds_bits[9] = 0;
        fStack_7e30.fds_bits[10] = 0;
        fStack_7e30.fds_bits[0xb] = 0;
        fStack_7e30.fds_bits[0xc] = 0;
        fStack_7e30.fds_bits[0xd] = 0;
        fStack_7e30.fds_bits[0xe] = 0;
        fStack_7e30.fds_bits[0xf] = 0;
        iVar3 = iVar13 + 0x3f;
        if (-1 < iVar13) {
          iVar3 = iVar13;
        }
        fStack_7e30.fds_bits[iVar3 >> 6] =
             fStack_7e30.fds_bits[iVar3 >> 6] | 1L << ((byte)(iVar13 % 0x40) & 0x3f);
        uVar11 = libssh2_session_block_directions(pcVar5);
        __readfds = &fStack_7e30;
        if ((uVar11 & 1) == 0) {
          __readfds = (fd_set *)0x0;
        }
        __writefds = &fStack_7e30;
        if ((uVar11 & 2) == 0) {
          __writefds = (fd_set *)0x0;
        }
        iVar3 = select(iVar13 + 1,__readfds,__writefds,(fd_set *)0x0,&tStack_7e40);
        return iVar3;
      }
      pcStack_7d90 = (code *)0x1027a8;
      main_cold_13();
    }
    else {
      pcStack_7d90 = (code *)0x10279f;
      main_cold_1();
    }
  }
  iVar3 = 0;
  session = (LIBSSH2_SESSION *)0x0;
LAB_00102b78:
  if (session != (LIBSSH2_SESSION *)0x0) {
    pcStack_7d90 = (code *)0x102b98;
    libssh2_session_disconnect_ex(session,0xb,"Normal Shutdown","");
    pcStack_7d90 = (code *)0x102ba0;
    libssh2_session_free(session);
  }
  if (uVar1 != 0xffffffff) {
    pcStack_7d90 = (code *)0x102bb1;
    shutdown(uVar1,2);
    pcStack_7d90 = (code *)0x102bb8;
    close(uVar1);
  }
  pcStack_7d90 = (code *)0x102bd8;
  fwrite("all done\n",9,1,_stderr);
  pcStack_7d90 = (code *)0x102bdd;
  libssh2_exit();
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    int exitcode = 0;
    char *exitsignal = (char *)"none";
    size_t len;
    LIBSSH2_KNOWNHOSTS *nh;
    int type;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostname = argv[1];  /* must be ip address only */
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* tell libssh2 we want it all done non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    nh = libssh2_knownhost_init(session);
    if(!nh) {
        /* eeek, do cleanup here */
        return 2;
    }

    /* read all hosts from here */
    libssh2_knownhost_readfile(nh, "known_hosts",
                               LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    /* store all known hosts to here */
    libssh2_knownhost_writefile(nh, "dumpfile",
                                LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    fingerprint = libssh2_session_hostkey(session, &len, &type);
    if(fingerprint) {
        struct libssh2_knownhost *host;
        int check = libssh2_knownhost_checkp(nh, hostname, 22,
                                             fingerprint, len,
                                             LIBSSH2_KNOWNHOST_TYPE_PLAIN|
                                             LIBSSH2_KNOWNHOST_KEYENC_RAW,
                                             &host);

        fprintf(stderr, "Host check: %d, key: %s\n", check,
                (check <= LIBSSH2_KNOWNHOST_CHECK_MISMATCH) ?
                host->key : "<none>");

        /*****
         * At this point, we could verify that 'check' tells us the key is
         * fine or bail out.
         *****/
    }
    else {
        /* eeek, do cleanup here */
        return 3;
    }
    libssh2_knownhost_free(nh);

    if(strlen(password) != 0) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            exit(1);
        }
    }

    libssh2_trace(session, LIBSSH2_TRACE_SOCKET);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "exec error\n");
        exit(1);
    }
    else {
        LIBSSH2_POLLFD *fds = NULL;
        int running = 1;
        size_t bufsize = BUFSIZE;
        char buffer[BUFSIZE];
        size_t totsize = 1500000;
        size_t totwritten = 0;
        size_t totread = 0;
        int rereads = 0;
        int rewrites = 0;
        int i;

        for(i = 0; i < BUFSIZE; i++)
            buffer[i] = 'A';

        fds = malloc(sizeof(LIBSSH2_POLLFD));
        if(!fds) {
            fprintf(stderr, "malloc failed\n");
            exit(1);
        }

        fds[0].type = LIBSSH2_POLLFD_CHANNEL;
        fds[0].fd.channel = channel;
        fds[0].events = LIBSSH2_POLLFD_POLLIN | LIBSSH2_POLLFD_POLLOUT;

        do {
            int act = 0;
            rc = libssh2_poll(fds, 1, 10);

            if(rc < 1)
                continue;

            if(fds[0].revents & LIBSSH2_POLLFD_POLLIN) {
                ssize_t n = libssh2_channel_read(channel,
                                                 buffer, sizeof(buffer));
                act++;

                if(n == LIBSSH2_ERROR_EAGAIN) {
                    rereads++;
                    fprintf(stderr, "will read again\n");
                }
                else if(n < 0) {
                    fprintf(stderr, "read failed\n");
                    exit(1);
                }
                else {
                    totread += (size_t)n;
                    fprintf(stderr, "read %ld bytes (%lu in total)\n",
                            (long)n, (unsigned long)totread);
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_POLLOUT) {
                act++;

                if(totwritten < totsize) {
                    /* we have not written all data yet */
                    size_t left = totsize - totwritten;
                    size_t size = (left < bufsize) ? left : bufsize;
                    ssize_t n = libssh2_channel_write_ex(channel, 0,
                                                         buffer, size);

                    if(n == LIBSSH2_ERROR_EAGAIN) {
                        rewrites++;
                        fprintf(stderr, "will write again\n");
                    }
                    else if(n < 0) {
                        fprintf(stderr, "write failed\n");
                        exit(1);
                    }
                    else {
                        totwritten += (size_t)n;
                        fprintf(stderr, "wrote %ld bytes (%lu in total)",
                                (long)n, (unsigned long)totwritten);
                        if(left >= bufsize && (size_t)n != bufsize) {
                            fprintf(stderr, " PARTIAL");
                        }
                        fprintf(stderr, "\n");
                    }
                }
                else {
                    /* all data written, send EOF */
                    rc = libssh2_channel_send_eof(channel);

                    if(rc == LIBSSH2_ERROR_EAGAIN) {
                        fprintf(stderr, "will send eof again\n");
                    }
                    else if(rc < 0) {
                        fprintf(stderr, "send eof failed\n");
                        exit(1);
                    }
                    else {
                        fprintf(stderr, "sent eof\n");
                        /* we're done writing, stop listening for OUT events */
                        fds[0].events &=
                            ~(unsigned long)LIBSSH2_POLLFD_POLLOUT;
                    }
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_CHANNEL_CLOSED) {
                if(!act) /* don't leave loop until we have read all data */
                    running = 0;
            }
        } while(running);

        exitcode = 127;
        while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN)
            waitsocket(sock, session);

        if(rc == 0) {
            exitcode = libssh2_channel_get_exit_status(channel);
            libssh2_channel_get_exit_signal(channel, &exitsignal,
                                            NULL, NULL, NULL, NULL, NULL);
        }

        if(exitsignal)
            fprintf(stderr, "\nGot signal: %s\n", exitsignal);

        libssh2_channel_free(channel);
        channel = NULL;

        fprintf(stderr, "\nrereads: %d rewrites: %d totwritten %lu\n",
                rereads, rewrites, (unsigned long)totwritten);

        if(totwritten != totread) {
            fprintf(stderr, "\n*** FAIL bytes written: "
                    "%lu bytes read: %lu ***\n",
                    (unsigned long)totwritten, (unsigned long)totread);
            exit(1);
        }
    }

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return exitcode;
}